

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockHouseholder.h
# Opt level: O0

void Eigen::internal::
     make_block_householder_triangular_factor<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
               (Matrix<double,__1,__1,_1,__1,__1> *triFactor,
               Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *vectors,
               Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *hCoeffs)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  Index IVar4;
  Scalar *pSVar5;
  CoeffReturnType CVar6;
  RowXpr local_720;
  Type local_6e8;
  RowXpr local_680;
  Type local_648;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>
  local_5e0;
  double local_550;
  Scalar z;
  Index j;
  Type local_508;
  Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>
  *local_4a0;
  Type local_498;
  Type local_430;
  ConstColXpr local_3c8;
  Type local_360;
  AdjointReturnType local_2c8;
  CoeffReturnType local_230;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>
  local_228;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>,_Eigen::TriangularView<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_5U>,_0>
  local_168;
  long local_40;
  Index rt;
  Index rs;
  Index i;
  Index nbVecs;
  Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *hCoeffs_local;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *vectors_local;
  Matrix<double,__1,__1,_1,__1,__1> *triFactor_local;
  
  nbVecs = (Index)hCoeffs;
  hCoeffs_local = (Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *)vectors;
  vectors_local = (Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)triFactor;
  i = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::cols
                ((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                  *)vectors);
  IVar4 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::rows
                    ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)vectors_local);
  bVar3 = false;
  if (IVar4 == i) {
    IVar4 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)vectors_local);
    bVar3 = false;
    if (IVar4 == i) {
      IVar4 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::
              rows((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                    *)hCoeffs_local);
      bVar3 = i <= IVar4;
    }
  }
  rs = i;
  if (bVar3) {
    while (rs = rs + -1, -1 < rs) {
      IVar4 = MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::
              rows((MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                    *)hCoeffs_local);
      rt = (IVar4 - rs) + -1;
      local_40 = (i - rs) + -1;
      if (0 < local_40) {
        local_230 = DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>
                    ::operator()((DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                                  *)nbVecs,rs);
        local_230 = -local_230;
        DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>::col
                  (&local_3c8,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
                    *)hCoeffs_local,rs);
        DenseBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>_>
        ::tail<long>(&local_360,
                     (DenseBase<Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>_>
                      *)&local_3c8,rt);
        MatrixBase<Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>
        ::adjoint(&local_2c8,
                  (MatrixBase<Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>
                   *)&local_360);
        Eigen::operator*(&local_228,&local_230,(StorageBaseType *)&local_2c8);
        DenseBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
        bottomRightCorner<long,long>
                  (&local_498,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                   hCoeffs_local,rt,local_40);
        MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>const,-1,-1,false>>
        ::triangularView<5u>(&local_430,&local_498);
        Eigen::operator*(&local_168,
                         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>_>
                          *)&local_228,
                         (TriangularViewImpl<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_5U,_Eigen::Dense>
                          *)&local_430);
        DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::row
                  ((RowXpr *)&j,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)vectors_local,rs);
        DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>::tail<long>
                  (&local_508,
                   (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                    *)&j,local_40);
        local_4a0 = (Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>
                     *)MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false>_>
                       ::noalias((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>
                                  *)&local_508);
        NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>,1,-1,false>,Eigen::MatrixBase>
        ::operator=((NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>,1,_1,false>,Eigen::MatrixBase>
                     *)&local_4a0,
                    (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>,_Eigen::TriangularView<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,__1,_false>,_5U>,_0>_>
                     *)&local_168);
        z = (Scalar)i;
        while (z = (Scalar)((long)z + -1), rs < (long)z) {
          pSVar5 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                              vectors_local,rs,(Index)z);
          dVar1 = *pSVar5;
          local_550 = dVar1;
          pSVar5 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                              vectors_local,(Index)z,(Index)z);
          dVar2 = *pSVar5;
          pSVar5 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                              vectors_local,rs,(Index)z);
          *pSVar5 = dVar1 * dVar2;
          if (0 < (i - (long)z) + -1) {
            DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::row
                      (&local_680,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)vectors_local,
                       (Index)z);
            DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>::
            tail<long>(&local_648,
                       (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                        *)&local_680,(i - (long)z) + -1);
            Eigen::operator*(&local_5e0,&local_550,(StorageBaseType *)&local_648);
            DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::row
                      (&local_720,
                       (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)vectors_local,rs);
            DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>_>::
            tail<long>(&local_6e8,
                       (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>_>
                        *)&local_720,(i - (long)z) + -1);
            MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>,1,-1,false>>
            ::operator+=((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>,1,_1,false>>
                          *)&local_6e8,
                         (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>_>
                          *)&local_5e0);
          }
        }
      }
      CVar6 = DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>
              ::operator()((DenseCoeffsBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                            *)nbVecs,rs);
      pSVar5 = DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                          vectors_local,rs,rs);
      *pSVar5 = CVar6;
    }
    return;
  }
  __assert_fail("triFactor.rows() == nbVecs && triFactor.cols() == nbVecs && vectors.rows()>=nbVecs"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Householder/BlockHouseholder.h"
                ,0x36,
                "void Eigen::internal::make_block_householder_triangular_factor(TriangularFactorType &, const VectorsType &, const CoeffsType &) [TriangularFactorType = Eigen::Matrix<double, -1, -1, 1, -1, -1>, VectorsType = Eigen::Block<Eigen::Matrix<double, -1, -1>>, CoeffsType = Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>]"
               );
}

Assistant:

void make_block_householder_triangular_factor(TriangularFactorType& triFactor, const VectorsType& vectors, const CoeffsType& hCoeffs)
{
  const Index nbVecs = vectors.cols();
  eigen_assert(triFactor.rows() == nbVecs && triFactor.cols() == nbVecs && vectors.rows()>=nbVecs);

  for(Index i = nbVecs-1; i >=0 ; --i)
  {
    Index rs = vectors.rows() - i - 1;
    Index rt = nbVecs-i-1;

    if(rt>0)
    {
      triFactor.row(i).tail(rt).noalias() = -hCoeffs(i) * vectors.col(i).tail(rs).adjoint()
                                                        * vectors.bottomRightCorner(rs, rt).template triangularView<UnitLower>();
            
      // FIXME use the following line with .noalias() once the triangular product can work inplace
      // triFactor.row(i).tail(rt) = triFactor.row(i).tail(rt) * triFactor.bottomRightCorner(rt,rt).template triangularView<Upper>();
      for(Index j=nbVecs-1; j>i; --j)
      {
        typename TriangularFactorType::Scalar z = triFactor(i,j);
        triFactor(i,j) = z * triFactor(j,j);
        if(nbVecs-j-1>0)
          triFactor.row(i).tail(nbVecs-j-1) += z * triFactor.row(j).tail(nbVecs-j-1);
      }
      
    }
    triFactor(i,i) = hCoeffs(i);
  }
}